

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsGenMi(octet *mi,size_t len,octet *m0,gen_i ang,void *ang_state)

{
  size_t n;
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  u64 *dest;
  err_t eVar4;
  long lVar5;
  u64 *a;
  
  if (ang == (gen_i)0x0) {
    eVar4 = 0x131;
  }
  else {
    eVar4 = 0x6d;
    if ((((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) &&
        (bVar1 = memIsValid(m0,len), bVar1 != 0)) && (bVar1 = memIsValid(mi,len), bVar1 != 0)) {
      n = (len >> 3) + 1;
      sVar3 = ppMinPolyMod_deep(n);
      dest = (u64 *)blobCreate(sVar3 + len * 2 + 0x10);
      if (dest == (u64 *)0x0) {
        eVar4 = 0x6e;
      }
      else {
        a = (u64 *)((long)dest + len + 8);
        u64From(dest,m0,len);
        *(undefined8 *)((long)dest + len) = 1;
        for (lVar5 = -3; lVar5 != 0; lVar5 = lVar5 + 1) {
          (*ang)(a,len,ang_state);
          u64From(a,a,len);
          *(undefined8 *)((long)a + len) = 0;
          ppMinPolyMod(a,a,dest,n,(void *)((long)dest + len * 2 + 0x10));
          if ((*(long *)((long)a + len) == 1) && (iVar2 = wwCmp(a,dest,len >> 3), iVar2 != 0)) {
            u64To(mi,len,a);
            eVar4 = 0;
            goto LAB_00125a23;
          }
        }
        bVar1 = wwEq(a,dest,n);
        eVar4 = 0x131;
        if (bVar1 == 0) {
          eVar4 = 0x1f9;
        }
LAB_00125a23:
        blobClose(dest);
      }
    }
  }
  return eVar4;
}

Assistant:

err_t belsGenMi(octet mi[], size_t len, const octet m0[], gen_i ang, 
	void* ang_state)
{
	size_t n, reps;
	err_t code;
	void* state;
	word* f0;
	word* u;
	word* f;
	void* stack;
	// проверить генератор
	if (ang == 0)
		return ERR_BAD_ANG;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m0, len) || !memIsValid(mi, len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(O_OF_W(2 * n + 2) + ppMinPolyMod_deep(n + 1));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	f = f0 + n + 1;
	u = f;
	stack = f + n + 1;
	// загрузить многочлен
	wwFrom(f0, m0, len);
	f0[n] = 1;
	// попытки генерации
	for (reps = 3; reps--; )
	{
		ang(u, len, ang_state);
		wwFrom(u, u, len), u[n] = 0;
		// f <- минимальный многочлен элемента u
		ppMinPolyMod(f, u, f0, n + 1, stack);
		// f подходит?
		if (f[n] == 1 && wwCmp(f, f0, n) != 0)
		{
			wwTo(mi, len, f);
			break;
		}
	}
	// завершение
	if (reps != SIZE_MAX)
		code = ERR_OK;
	else if (wwEq(f, f0, n + 1))
		code = ERR_BAD_ANG;
	else 
		code = ERR_BAD_PUBKEY;
	blobClose(state);
	return code;
}